

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpWatchDog.c
# Opt level: O2

void qpWatchDog_destroy(qpWatchDog *dog)

{
  dog->status = STATUS_STOP_THREAD;
  deThread_join(dog->watchDogThread);
  deThread_destroy(dog->watchDogThread);
  deFree(dog);
  return;
}

Assistant:

void qpWatchDog_destroy (qpWatchDog* dog)
{
	DE_ASSERT(dog);
	DBGPRINT(("qpWatchDog::destroy()\n"));

	/* Finish the watchdog thread. */
	dog->status = STATUS_STOP_THREAD;
	deThread_join(dog->watchDogThread);
	deThread_destroy(dog->watchDogThread);

	DBGPRINT(("qpWatchDog::destroy() finished\n"));
	deFree(dog);
}